

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SceneLoader::begin__instance_kinematics_scene
          (SceneLoader *this,instance_kinematics_scene__AttributeData *attributeData)

{
  void *pvVar1;
  long *plVar2;
  KinematicsInstanceKinematicsScene *this_00;
  long in_RSI;
  long *in_RDI;
  URI url;
  URI *fileUri;
  URI *in_stack_fffffffffffffdd8;
  KinematicsInstanceKinematicsScene *in_stack_fffffffffffffde0;
  String *in_stack_fffffffffffffe20;
  URI *in_stack_fffffffffffffe28;
  URI *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe67;
  URI *in_stack_fffffffffffffe68;
  URI *in_stack_fffffffffffffe70;
  
  pvVar1 = operator_new(0x108);
  KinematicsInstanceKinematicsScene::KinematicsInstanceKinematicsScene(in_stack_fffffffffffffde0);
  in_RDI[0xc] = (long)pvVar1;
  plVar2 = (long *)(**(code **)(*in_RDI + 0x10))();
  this_00 = (KinematicsInstanceKinematicsScene *)(**(code **)(*plVar2 + 0x58))();
  COLLADABU::URI::getURIString_abi_cxx11_((URI *)(in_RSI + 8));
  COLLADABU::URI::URI(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20)
  ;
  COLLADABU::URI::URI(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                      (bool)in_stack_fffffffffffffe67);
  KinematicsInstanceKinematicsScene::setUrl(this_00,in_stack_fffffffffffffdd8);
  COLLADABU::URI::~URI((URI *)this_00);
  COLLADABU::URI::~URI((URI *)this_00);
  return true;
}

Assistant:

bool SceneLoader::begin__instance_kinematics_scene( const instance_kinematics_scene__AttributeData& attributeData )
	{
		mCurrentInstanceKinematicsScene = new KinematicsInstanceKinematicsScene();
		const COLLADABU::URI& fileUri = getFileLoader()->getFileUri();
		COLLADABU::URI url(fileUri, attributeData.url.getURIString());
		mCurrentInstanceKinematicsScene->setUrl( url);
		return true;
	}